

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

mcpl_generic_wfilehandle_t *
mcpl_generic_wfopen(mcpl_generic_wfilehandle_t *__return_storage_ptr__,char *filename)

{
  MCTOOLS_FILE_t *pMVar1;
  mcu8str f;
  mcu8str mStack_28;
  
  __return_storage_ptr__->mode = 0;
  __return_storage_ptr__->current_pos = 0;
  mcu8str_view_cstr(&mStack_28,filename);
  pMVar1 = mctools_fopen(&mStack_28,"wb");
  __return_storage_ptr__->internal = pMVar1;
  if (pMVar1 != (MCTOOLS_FILE_t *)0x0) {
    return __return_storage_ptr__;
  }
  (*mcpl_error_handler)("Unable to open file for writing!");
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
}

Assistant:

mcpl_generic_wfilehandle_t mcpl_generic_wfopen( const char * filename )
{
  mcpl_generic_wfilehandle_t res;
  res.mode = 0;
  res.current_pos = 0;
  res.internal = NULL;
  res.internal = (void*)mcpl_internal_fopen(filename,"wb");
  if (!res.internal)
    mcpl_error("Unable to open file for writing!");
  return res;
}